

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAX2.c
# Opt level: O2

xmlParserInputPtr xmlSAX2ResolveEntity(void *ctx,xmlChar *publicId,xmlChar *systemId)

{
  int iVar1;
  xmlParserInputPtr pxVar2;
  xmlChar *str;
  xmlChar *URI;
  
  URI = (xmlChar *)0x0;
  if (ctx != (void *)0x0) {
    if (systemId == (xmlChar *)0x0) {
LAB_00144c1b:
      pxVar2 = xmlLoadResource((xmlParserCtxtPtr)ctx,(char *)URI,(char *)publicId,XML_RESOURCE_DTD);
      (*xmlFree)(URI);
      return pxVar2;
    }
    if ((*(long *)((long)ctx + 0x38) == 0) ||
       (str = *(xmlChar **)(*(long *)((long)ctx + 0x38) + 8), str == (xmlChar *)0x0)) {
      str = *(xmlChar **)((long)ctx + 0x118);
    }
    iVar1 = xmlStrlen(systemId);
    if ((iVar1 < 0x7d1) && (iVar1 = xmlStrlen(str), iVar1 < 0x7d1)) {
      iVar1 = xmlBuildURISafe(systemId,str,&URI);
      if (URI == (xmlChar *)0x0) {
        if (iVar1 < 0) {
          xmlCtxtErrMemory((xmlParserCtxtPtr)ctx);
        }
        else {
          xmlWarnMsg((xmlParserCtxtPtr)ctx,XML_ERR_INVALID_URI,"Can\'t resolve URI: %s\n",systemId);
        }
      }
      else {
        iVar1 = xmlStrlen(URI);
        if (iVar1 < 0x7d1) goto LAB_00144c1b;
        xmlFatalErr((xmlParserCtxtPtr)ctx,XML_ERR_RESOURCE_LIMIT,"URI too long");
        (*xmlFree)(URI);
      }
    }
    else {
      xmlFatalErr((xmlParserCtxtPtr)ctx,XML_ERR_RESOURCE_LIMIT,"URI too long");
    }
  }
  return (xmlParserInputPtr)0x0;
}

Assistant:

xmlParserInputPtr
xmlSAX2ResolveEntity(void *ctx, const xmlChar *publicId,
                     const xmlChar *systemId)
{
    xmlParserCtxtPtr ctxt = (xmlParserCtxtPtr) ctx;
    xmlParserInputPtr ret = NULL;
    xmlChar *URI = NULL;

    if (ctx == NULL) return(NULL);

    if (systemId != NULL) {
        const xmlChar *base = NULL;
        int res;

        if (ctxt->input != NULL)
            base = BAD_CAST ctxt->input->filename;

        /*
         * We don't really need the 'directory' struct member, but some
         * users set it manually to a base URI for memory streams.
         */
        if (base == NULL)
            base = BAD_CAST ctxt->directory;

        if ((xmlStrlen(systemId) > XML_MAX_URI_LENGTH) ||
            (xmlStrlen(base) > XML_MAX_URI_LENGTH)) {
            xmlFatalErr(ctxt, XML_ERR_RESOURCE_LIMIT, "URI too long");
            return(NULL);
        }
        res = xmlBuildURISafe(systemId, base, &URI);
        if (URI == NULL) {
            if (res < 0)
                xmlSAX2ErrMemory(ctxt);
            else
                xmlWarnMsg(ctxt, XML_ERR_INVALID_URI,
                           "Can't resolve URI: %s\n", systemId);
            return(NULL);
        }
        if (xmlStrlen(URI) > XML_MAX_URI_LENGTH) {
            xmlFatalErr(ctxt, XML_ERR_RESOURCE_LIMIT, "URI too long");
            xmlFree(URI);
            return(NULL);
        }
    }

    ret = xmlLoadResource(ctxt, (const char *) URI,
                          (const char *) publicId, XML_RESOURCE_DTD);

    xmlFree(URI);
    return(ret);
}